

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_prepend(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  
  if (getp_prepend(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_prepend(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar1 != 0) {
      getp_prepend::desc.min_argc_ = 1;
      getp_prepend::desc.opt_argc_ = 0;
      getp_prepend::desc.varargs_ = 0;
      __cxa_guard_release(&getp_prepend(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_prepend::desc);
  if (iVar1 == 0) {
    insert_elements_undo(this,self,0,1);
    vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + 4,sp_ + -1);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_prepend(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* insert one element at the start of the vector */
    insert_elements_undo(vmg_ self, 0, 1);

    /* 
     *   set the first element - note that there's no need to save undo,
     *   since undoing this operation will simply discard this element (in
     *   other words, there's no previous value for this element since it's
     *   being created anew here) 
     */
    set_element(0, G_stk->get(0));

    /* the return value is 'self' */
    retval->set_obj(self);

    /* discard arguments */
    G_stk->discard(1);

    /* handled */
    return TRUE;
}